

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::RenderTextWrapped(ImVec2 pos,char *text,char *text_end,float wrap_width)

{
  float font_size;
  ImGuiWindow *pIVar1;
  ImDrawList *this;
  ImFont *font;
  undefined4 uVar2;
  undefined4 uVar3;
  ImGuiContext *pIVar4;
  ImU32 col;
  size_t sVar5;
  ImGuiContext *g;
  ImVec2 local_40;
  ImVec4 local_38;
  
  pIVar4 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->Accessed = true;
  local_40 = pos;
  if (text_end == (char *)0x0) {
    sVar5 = strlen(text);
    text_end = text + sVar5;
  }
  if (0 < (int)text_end - (int)text) {
    this = pIVar1->DrawList;
    font = pIVar4->Font;
    font_size = pIVar4->FontSize;
    local_38.x = (pIVar4->Style).Colors[0].x;
    local_38.y = (pIVar4->Style).Colors[0].y;
    uVar2 = (pIVar4->Style).Colors[0].z;
    uVar3 = (pIVar4->Style).Colors[0].w;
    local_38.w = (pIVar4->Style).Alpha * (float)uVar3;
    local_38.z = (float)uVar2;
    col = ColorConvertFloat4ToU32(&local_38);
    ImDrawList::AddText(this,font,font_size,&local_40,col,text,text_end,wrap_width,(ImVec4 *)0x0);
    if (pIVar4->LogEnabled == true) {
      LogRenderedText(&local_40,text,text_end);
    }
  }
  return;
}

Assistant:

void ImGui::RenderTextWrapped(ImVec2 pos, const char* text, const char* text_end, float wrap_width)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    if (!text_end)
        text_end = text + strlen(text); // FIXME-OPT

    const int text_len = (int)(text_end - text);
    if (text_len > 0)
    {
        window->DrawList->AddText(g.Font, g.FontSize, pos, GetColorU32(ImGuiCol_Text), text, text_end, wrap_width);
        if (g.LogEnabled)
            LogRenderedText(pos, text, text_end);
    }
}